

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fPolygonOffsetTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_0::UsageDisplacementTestCase::testPolygonOffset
          (UsageDisplacementTestCase *this)

{
  code *pcVar1;
  TestContext *testCtx;
  undefined *puVar2;
  size_t log_00;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  TestError *this_00;
  MessageBuilder *pMVar7;
  float *pfVar8;
  undefined8 extraout_XMM0_Qa;
  undefined8 uVar9;
  Vec4 VVar10;
  Vector<float,_4> *local_1018;
  float local_1008;
  ConstPixelBufferAccess local_f78;
  ConstPixelBufferAccess local_f50;
  Vector<float,_4> local_f28;
  PixelBufferAccess local_f18;
  MessageBuilder local_ef0;
  PixelBufferAccess local_d70;
  MessageBuilder local_d48;
  MessageBuilder local_bc8;
  MessageBuilder local_a48;
  MessageBuilder local_8c8;
  ulong local_748;
  size_t ndx;
  undefined1 local_5bc [20];
  undefined1 local_5a8 [4];
  int vertexNdx;
  Vec4 triangle [3];
  float offset;
  undefined1 local_568 [3];
  bool offsetDirection;
  int iterationNdx;
  MessageBuilder local_3e8;
  undefined4 local_268;
  undefined4 local_264;
  int numIterations;
  GLint colorLoc;
  GLint positionLoc;
  allocator<char> local_231;
  string local_230;
  ProgramSources local_210;
  undefined1 local_140 [8];
  ShaderProgram program;
  Functions *gl;
  Surface referenceImage;
  undefined1 local_40 [8];
  Surface testImage;
  TestLog *log;
  Random rnd;
  UsageDisplacementTestCase *this_local;
  
  rnd.m_rnd._8_8_ = this;
  de::Random::Random((Random *)&log,0xdec0de);
  testImage.m_pixels.m_cap =
       (size_t)tcu::TestContext::getLog
                         ((this->super_PolygonOffsetTestCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx);
  iVar4 = (this->super_PolygonOffsetTestCase).m_targetSize;
  tcu::Surface::Surface((Surface *)local_40,iVar4,iVar4);
  iVar4 = (this->super_PolygonOffsetTestCase).m_targetSize;
  tcu::Surface::Surface((Surface *)&gl,iVar4,iVar4);
  pRVar6 = gles2::Context::getRenderContext
                     ((this->super_PolygonOffsetTestCase).super_TestCase.m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  program.m_program.m_info.linkTimeUs = CONCAT44(extraout_var,iVar4);
  pRVar6 = gles2::Context::getRenderContext
                     ((this->super_PolygonOffsetTestCase).super_TestCase.m_context);
  puVar2 = Functional::(anonymous_namespace)::s_shaderSourceVertex;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,puVar2,&local_231);
  puVar2 = Functional::(anonymous_namespace)::s_shaderSourceFragment;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&positionLoc,puVar2,(allocator<char> *)((long)&colorLoc + 3));
  glu::makeVtxFragSources(&local_210,&local_230,(string *)&positionLoc);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_140,pRVar6,&local_210);
  glu::ProgramSources::~ProgramSources(&local_210);
  std::__cxx11::string::~string((string *)&positionLoc);
  std::allocator<char>::~allocator((allocator<char> *)((long)&colorLoc + 3));
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  pcVar1 = *(code **)(program.m_program.m_info.linkTimeUs + 0x780);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_140);
  numIterations = (*pcVar1)(dVar5,"a_position");
  pcVar1 = *(code **)(program.m_program.m_info.linkTimeUs + 0x780);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_140);
  local_264 = (*pcVar1)(dVar5,"a_color");
  local_268 = 0x28;
  bVar3 = glu::ShaderProgram::isOk((ShaderProgram *)local_140);
  if (!bVar3) {
    glu::operator<<((TestLog *)testImage.m_pixels.m_cap,(ShaderProgram *)local_140);
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compile failed.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fPolygonOffsetTests.cpp"
               ,0x1f8);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1d0))(0x3f800000);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x188))(0x4100);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1a00))
            (0,0,(this->super_PolygonOffsetTestCase).m_targetSize);
  pcVar1 = *(code **)(program.m_program.m_info.linkTimeUs + 0x1680);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_140);
  (*pcVar1)(dVar5);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x5e0))(0xb71);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x5e0))(0x8037);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x610))(numIterations);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1858))(0,0x3f800000,local_264);
  tcu::TestLog::operator<<
            (&local_3e8,(TestLog *)testImage.m_pixels.m_cap,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     (&local_3e8,(char (*) [42])"Framebuffer cleared, clear color = Black.");
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_3e8);
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_568,(TestLog *)testImage.m_pixels.m_cap,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_568,(char (*) [29])0x2b7f2b3);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_568);
  for (offset = 0.0; (int)offset < 0x28; offset = (float)((int)offset + 1)) {
    bVar3 = de::Random::getBool((Random *)&log);
    uVar9 = 0x3f800000;
    local_1008 = -1.0;
    if (!bVar3) {
      local_1008 = 1.0;
    }
    triangle[2].m_data[3] = local_1008;
    local_1018 = (Vector<float,_4> *)local_5a8;
    do {
      tcu::Vector<float,_4>::Vector(local_1018);
      VVar10.m_data[2] = (float)(int)uVar9;
      VVar10.m_data[3] = (float)(int)((ulong)uVar9 >> 0x20);
      VVar10.m_data[0] = (float)(int)extraout_XMM0_Qa;
      VVar10.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
      local_1018 = local_1018 + 1;
    } while (local_1018 != (Vector<float,_4> *)(triangle[2].m_data + 2));
    local_5bc._16_4_ = 0;
    while( true ) {
      if (2 < (int)local_5bc._16_4_) break;
      VVar10 = genRandomVec4((UsageDisplacementTestCase *)local_5bc,(Random *)this);
      *(undefined8 *)(local_5a8 + (long)(int)local_5bc._16_4_ * 0x10) = local_5bc._0_8_;
      *(undefined8 *)triangle[(int)local_5bc._16_4_].m_data = local_5bc._8_8_;
      local_5bc._16_4_ = local_5bc._16_4_ + 1;
    }
    (**(code **)(program.m_program.m_info.linkTimeUs + 0x19f0))
              (VVar10.m_data._0_8_,numIterations,4,0x1406,0,0,local_5a8);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&ndx,(TestLog *)testImage.m_pixels.m_cap,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&ndx,
                        (char (*) [40])"Setup triangle with random coordinates:");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&ndx);
    for (local_748 = 0; local_748 < 3; local_748 = local_748 + 1) {
      tcu::TestLog::operator<<
                (&local_8c8,(TestLog *)testImage.m_pixels.m_cap,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<(&local_8c8,(char (*) [4])"\tx=");
      pfVar8 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(local_5a8 + local_748 * 0x10));
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,pfVar8);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [4])"\ty=");
      pfVar8 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(local_5a8 + local_748 * 0x10));
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,pfVar8);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [4])"\tz=");
      pfVar8 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(local_5a8 + local_748 * 0x10));
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,pfVar8);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [4])"\tw=");
      pfVar8 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(local_5a8 + local_748 * 0x10));
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,pfVar8);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_8c8);
    }
    tcu::TestLog::operator<<
              (&local_a48,(TestLog *)testImage.m_pixels.m_cap,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_a48,
                        (char (*) [76])
                        "Draw colorless triangle.\tState: DepthFunc = GL_ALWAYS, PolygonOffset(0, 0)."
                       );
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_a48);
    (**(code **)(program.m_program.m_info.linkTimeUs + 0x4a0))(0x207);
    (**(code **)(program.m_program.m_info.linkTimeUs + 0x1028))(0);
    (**(code **)(program.m_program.m_info.linkTimeUs + 0x238))(0,0,0);
    (**(code **)(program.m_program.m_info.linkTimeUs + 0x538))(4,0,3);
    tcu::TestLog::operator<<
              (&local_bc8,(TestLog *)testImage.m_pixels.m_cap,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_bc8,
                        (char (*) [68])
                        "Draw green triangle.\tState: DepthFunc = GL_EQUAL, PolygonOffset(0, ");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,triangle[2].m_data + 3);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2c156ab);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_bc8);
    (**(code **)(program.m_program.m_info.linkTimeUs + 0x4a0))(0x202);
    (**(code **)(program.m_program.m_info.linkTimeUs + 0x1028))(0,triangle[2].m_data[3]);
    (**(code **)(program.m_program.m_info.linkTimeUs + 0x238))(1,1,1);
    (**(code **)(program.m_program.m_info.linkTimeUs + 0x538))(4,0,3);
    tcu::TestLog::operator<<
              (&local_d48,(TestLog *)testImage.m_pixels.m_cap,
               (BeginMessageToken *)&tcu::TestLog::Message);
    tcu::MessageBuilder::operator<<(&local_d48,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_d48);
  }
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x518))(numIterations);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1680))(0);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x648))();
  pRVar6 = gles2::Context::getRenderContext
                     ((this->super_PolygonOffsetTestCase).super_TestCase.m_context);
  tcu::Surface::getAccess(&local_d70,(Surface *)local_40);
  glu::readPixels(pRVar6,0,0,&local_d70);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_140);
  tcu::TestLog::operator<<
            (&local_ef0,(TestLog *)testImage.m_pixels.m_cap,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_ef0,(char (*) [29])"Expecting black framebuffer.")
  ;
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_ef0);
  tcu::Surface::getAccess(&local_f18,(Surface *)&gl);
  tcu::Vector<float,_4>::Vector(&local_f28,0.0,0.0,0.0,1.0);
  tcu::clear(&local_f18,&local_f28);
  log_00 = testImage.m_pixels.m_cap;
  testCtx = (this->super_PolygonOffsetTestCase).super_TestCase.super_TestCase.super_TestNode.
            m_testCtx;
  pRVar6 = gles2::Context::getRenderContext
                     ((this->super_PolygonOffsetTestCase).super_TestCase.m_context);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_f50,(Surface *)local_40);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_f78,(Surface *)&gl);
  verifyImages((TestLog *)log_00,testCtx,pRVar6,&local_f50,&local_f78);
  tcu::Surface::~Surface((Surface *)&gl);
  tcu::Surface::~Surface((Surface *)local_40);
  de::Random::~Random((Random *)&log);
  return;
}

Assistant:

void UsageDisplacementTestCase::testPolygonOffset (void)
{
	using tcu::TestLog;

	de::Random			rnd				(0xdec0de);
	tcu::TestLog&		log				= m_testCtx.getLog();
	tcu::Surface		testImage		(m_targetSize, m_targetSize);
	tcu::Surface		referenceImage	(m_targetSize, m_targetSize);

	// render test image
	{
		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const glu::ShaderProgram	program			(m_context.getRenderContext(), glu::makeVtxFragSources(s_shaderSourceVertex, s_shaderSourceFragment));
		const GLint					positionLoc		= gl.getAttribLocation(program.getProgram(), "a_position");
		const GLint					colorLoc		= gl.getAttribLocation(program.getProgram(), "a_color");
		const int					numIterations	= 40;

		if (!program.isOk())
		{
			log << program;
			TCU_FAIL("Shader compile failed.");
		}

		gl.clearColor				(0, 0, 0, 1);
		gl.clearDepthf				(1.0f);
		gl.clear					(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		gl.viewport					(0, 0, m_targetSize, m_targetSize);
		gl.useProgram				(program.getProgram());
		gl.enable					(GL_DEPTH_TEST);
		gl.enable					(GL_POLYGON_OFFSET_FILL);
		gl.enableVertexAttribArray	(positionLoc);
		gl.vertexAttrib4f			(colorLoc, 0.0f, 1.0f, 0.0f, 1.0f);

		log << TestLog::Message << "Framebuffer cleared, clear color = Black." << TestLog::EndMessage;
		log << TestLog::Message << "POLYGON_OFFSET_FILL enabled." << TestLog::EndMessage;

		// draw colorless (mask = 0,0,0) triangle at random* location, set offset and render green triangle with depthfunc = equal
		// *) w >= 1.0 and z in (-1, 1) range
		for (int iterationNdx = 0; iterationNdx < numIterations; ++iterationNdx)
		{
			const bool		offsetDirection = rnd.getBool();
			const float		offset = offsetDirection ? -1.0f : 1.0f;
			tcu::Vec4		triangle[3];

			for (int vertexNdx = 0; vertexNdx < DE_LENGTH_OF_ARRAY(triangle); ++vertexNdx)
				triangle[vertexNdx] = genRandomVec4(rnd);

			gl.vertexAttribPointer		(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, triangle);

			log << TestLog::Message << "Setup triangle with random coordinates:" << TestLog::EndMessage;
			for (size_t ndx = 0; ndx < DE_LENGTH_OF_ARRAY(triangle); ++ndx)
				log << TestLog::Message
						<< "\tx=" << triangle[ndx].x()
						<< "\ty=" << triangle[ndx].y()
						<< "\tz=" << triangle[ndx].z()
						<< "\tw=" << triangle[ndx].w()
						<< TestLog::EndMessage;

			log << TestLog::Message << "Draw colorless triangle.\tState: DepthFunc = GL_ALWAYS, PolygonOffset(0, 0)." << TestLog::EndMessage;

			gl.depthFunc				(GL_ALWAYS);
			gl.polygonOffset			(0, 0);
			gl.colorMask				(GL_FALSE, GL_FALSE, GL_FALSE, GL_FALSE);
			gl.drawArrays				(GL_TRIANGLES, 0, 3);

			// all fragments should have different Z => DepthFunc == GL_EQUAL fails with every fragment

			log << TestLog::Message << "Draw green triangle.\tState: DepthFunc = GL_EQUAL, PolygonOffset(0, " << offset << ")." << TestLog::EndMessage;

			gl.depthFunc				(GL_EQUAL);
			gl.polygonOffset			(0, offset);
			gl.colorMask				(GL_TRUE, GL_TRUE, GL_TRUE, GL_TRUE);
			gl.drawArrays				(GL_TRIANGLES, 0, 3);

			log << TestLog::Message << TestLog::EndMessage; // empty line for clarity
		}

		gl.disableVertexAttribArray	(positionLoc);
		gl.useProgram				(0);
		gl.finish					();

		glu::readPixels(m_context.getRenderContext(), 0, 0, testImage.getAccess());
	}

	// render reference image
	log << TestLog::Message << "Expecting black framebuffer." << TestLog::EndMessage;
	tcu::clear(referenceImage.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	// compare
	verifyImages(log, m_testCtx, m_context.getRenderContext(), testImage.getAccess(), referenceImage.getAccess());
}